

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 roundAndPackFloatx80_aarch64
                   (int8_t roundingPrecision,flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,
                   float_status *status)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  undefined7 in_register_00000039;
  ulong uVar10;
  bool bVar11;
  floatx80 fVar12;
  
  bVar1 = status->float_rounding_mode;
  iVar9 = (int)CONCAT71(in_register_00000039,roundingPrecision);
  cVar5 = (char)zExp;
  if (iVar9 == 0x40) {
    uVar2 = 0x7ff;
    uVar10 = 0x400;
LAB_005e9b81:
    if (4 < bVar1) goto switchD_005e9bce_default;
    switch(bVar1) {
    case 1:
      uVar10 = 0;
      if (zSign != '\0') {
        uVar10 = uVar2;
      }
      break;
    case 2:
      uVar10 = 0;
      if (zSign == '\0') {
        uVar10 = uVar2;
      }
      break;
    case 3:
      uVar10 = 0;
    }
    uVar8 = zSig1 != 0 | zSig0;
    if (0xffff8002 < zExp - 0x7ffeU) {
LAB_005e9c1f:
      if ((uVar2 & uVar8) != 0) {
        status->float_exception_flags = status->float_exception_flags | 0x20;
      }
      uVar4 = uVar10 + uVar8;
      if (CARRY8(uVar10,uVar8)) {
        uVar4 = 0x8000000000000000;
      }
      uVar6 = uVar2 + 1;
      if ((uVar2 & uVar8) * 2 != uVar2 + 1) {
        uVar6 = 0;
      }
      if (bVar1 != 0) {
        uVar6 = 0;
      }
      zSig0 = ~(uVar6 | uVar2) & uVar4;
      iVar9 = zExp + (uint)CARRY8(uVar10,uVar8);
      if (zSig0 == 0) {
        iVar9 = 0;
      }
      uVar3 = (uint)zSign * 0x8000 + iVar9;
      goto LAB_005e9d64;
    }
    if ((zExp < 0x7fff) && ((zExp != 0x7ffe || (uVar10 <= ~uVar8)))) {
      if (zExp < 1) {
        if (status->flush_to_zero == '\0') {
          if (zExp < -0x3e) {
            uVar4 = (ulong)(uVar8 != 0);
          }
          else {
            uVar4 = (ulong)(uVar8 << (cVar5 - 1U & 0x3f) != 0) | uVar8 >> (1U - cVar5 & 0x3f);
          }
          uVar6 = uVar4 & uVar2;
          if ((uVar10 <= ~uVar8 || (zExp != 0 || status->float_detect_tininess == '\x01')) &&
              uVar6 != 0) {
            status->float_exception_flags = status->float_exception_flags | 0x10;
          }
          if (uVar6 != 0) {
            status->float_exception_flags = status->float_exception_flags | 0x20;
          }
          uVar8 = uVar2 + 1;
          if (uVar6 * 2 != uVar2 + 1) {
            uVar8 = 0;
          }
          if (bVar1 != 0) {
            uVar8 = 0;
          }
          zSig0 = ~(uVar8 | uVar2) & uVar4 + uVar10;
          uVar3 = (uint)zSign << 0xf | (uint)(uVar4 + uVar10 >> 0x3f);
        }
        else {
          status->float_exception_flags = status->float_exception_flags | 0x80;
          uVar3 = (uint)zSign << 0xf;
          zSig0 = 0;
        }
        goto LAB_005e9d64;
      }
      goto LAB_005e9c1f;
    }
    goto LAB_005e9cbc;
  }
  if (iVar9 == 0x20) {
    uVar2 = 0xffffffffff;
    uVar10 = 0x8000000000;
    goto LAB_005e9b81;
  }
  switch(bVar1) {
  case 0:
  case 4:
    bVar7 = (byte)(zSig1 >> 0x3f);
    break;
  case 1:
    bVar11 = zSign != '\0';
    goto LAB_005e9c8b;
  case 2:
    bVar11 = zSign == '\0';
LAB_005e9c8b:
    bVar7 = zSig1 != 0 & bVar11;
    break;
  case 3:
    bVar7 = 0;
    break;
  default:
    goto switchD_005e9bce_default;
  }
  if (0xffff8002 < zExp - 0x7ffeU) {
LAB_005e9d10:
    if (zSig1 != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    if (bVar7 == 0) {
      if (zSig0 == 0) {
        zExp = 0;
      }
    }
    else if (zSig0 + 1 == 0) {
      zExp = zExp + 1;
      zSig0 = 0x8000000000000000;
    }
    else {
      zSig0 = zSig0 + 1 & ~(ulong)((zSig1 & 0x7fffffffffffffff) == 0 && bVar1 == 0);
    }
    uVar3 = (uint)zSign * 0x8000 + zExp;
    goto LAB_005e9d64;
  }
  if ((0x7ffe < zExp) || (((zSig0 == 0xffffffffffffffff && zExp == 0x7ffe) & bVar7) == 1)) {
    uVar2 = 0;
LAB_005e9cbc:
    status->float_exception_flags = status->float_exception_flags | 0x28;
    if (((bVar1 == 3) || (zSign != '\0' && bVar1 == 2)) || (bVar1 == 1 && zSign == '\0')) {
      zSig0 = ~uVar2;
      uVar3 = (uint)zSign << 0xf | 0x7ffe;
    }
    else {
      uVar3 = (uint)zSign << 0xf | 0x7fff;
      zSig0 = 0x8000000000000000;
    }
    goto LAB_005e9d64;
  }
  if (0 < zExp) goto LAB_005e9d10;
  bVar11 = zSig0 != 0xffffffffffffffff;
  if (zExp < -0x3e) {
    if (zExp == -0x3f) {
      uVar10 = zSig1 != 0 | zSig0;
    }
    else {
      uVar10 = (ulong)(zSig1 != 0 || zSig0 != 0);
    }
    zSig0 = 0;
  }
  else {
    uVar10 = (ulong)(zSig1 != 0) | zSig0 << (cVar5 - 1U & 0x3f);
    zSig0 = zSig0 >> (1U - cVar5 & 0x3f);
  }
  if (((bVar7 & zExp == 0 & status->float_detect_tininess != '\x01' ^ 1 | bVar11) & uVar10 != 0) ==
      1) {
    status->float_exception_flags = status->float_exception_flags | 0x10;
  }
  if (uVar10 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  switch(bVar1) {
  case 0:
  case 4:
    bVar7 = (byte)(uVar10 >> 0x3f);
    break;
  case 1:
    bVar11 = zSign != '\0';
    goto LAB_005e9ee2;
  case 2:
    bVar11 = zSign == '\0';
LAB_005e9ee2:
    bVar7 = bVar11 & uVar10 != 0;
    break;
  case 3:
    bVar7 = 0;
    break;
  default:
switchD_005e9bce_default:
    abort();
  }
  if (bVar7 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = zSig0 + 1;
    zSig0 = ~(ulong)((uVar10 & 0x7fffffffffffffff) == 0 && bVar1 == 0) & uVar2;
    uVar3 = (uint)(uVar2 >> 0x3f);
  }
  uVar3 = uVar3 | (uint)zSign << 0xf;
LAB_005e9d64:
  fVar12._8_4_ = uVar3;
  fVar12.low = zSig0;
  fVar12._12_4_ = 0;
  return fVar12;
}

Assistant:

floatx80 roundAndPackFloatx80(int8_t roundingPrecision, flag zSign,
                              int32_t zExp, uint64_t zSig0, uint64_t zSig1,
                              float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment, isTiny;
    int64_t roundIncrement, roundMask, roundBits;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    if ( roundingPrecision == 80 ) goto precision80;
    if ( roundingPrecision == 64 ) {
        roundIncrement = UINT64_C(0x0000000000000400);
        roundMask = UINT64_C(0x00000000000007FF);
    }
    else if ( roundingPrecision == 32 ) {
        roundIncrement = UINT64_C(0x0000008000000000);
        roundMask = UINT64_C(0x000000FFFFFFFFFF);
    }
    else {
        goto precision80;
    }
    zSig0 |= ( zSig1 != 0 );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : roundMask;
        break;
    case float_round_down:
        roundIncrement = zSign ? roundMask : 0;
        break;
    default:
        abort();
    }
    roundBits = zSig0 & roundMask;
    if ( 0x7FFD <= (uint32_t) ( zExp - 1 ) ) {
        if (    ( 0x7FFE < zExp )
             || ( ( zExp == 0x7FFE ) && ( zSig0 + roundIncrement < zSig0 ) )
           ) {
            goto overflow;
        }
        if ( zExp <= 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloatx80(zSign, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < 0 )
                || ( zSig0 <= zSig0 + roundIncrement );
            shift64RightJamming( zSig0, 1 - zExp, &zSig0 );
            zExp = 0;
            roundBits = zSig0 & roundMask;
            if (isTiny && roundBits) {
                float_raise(float_flag_underflow, status);
            }
            if (roundBits) {
                status->float_exception_flags |= float_flag_inexact;
            }
            zSig0 += roundIncrement;
            if ( (int64_t) zSig0 < 0 ) zExp = 1;
            roundIncrement = roundMask + 1;
            if ( roundNearestEven && ( roundBits<<1 == roundIncrement ) ) {
                roundMask |= roundIncrement;
            }
            zSig0 &= ~ roundMask;
            return packFloatx80( zSign, zExp, zSig0 );
        }
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    zSig0 += roundIncrement;
    if ( zSig0 < roundIncrement ) {
        ++zExp;
        zSig0 = UINT64_C(0x8000000000000000);
    }
    roundIncrement = roundMask + 1;
    if ( roundNearestEven && ( roundBits<<1 == roundIncrement ) ) {
        roundMask |= roundIncrement;
    }
    zSig0 &= ~ roundMask;
    if ( zSig0 == 0 ) zExp = 0;
    return packFloatx80( zSign, zExp, zSig0 );
 precision80:
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t)zSig1 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && zSig1;
        break;
    case float_round_down:
        increment = zSign && zSig1;
        break;
    default:
        abort();
    }
    if ( 0x7FFD <= (uint32_t) ( zExp - 1 ) ) {
        if (    ( 0x7FFE < zExp )
             || (    ( zExp == 0x7FFE )
                  && ( zSig0 == UINT64_C(0xFFFFFFFFFFFFFFFF) )
                  && increment
                )
           ) {
            roundMask = 0;
 overflow:
            float_raise(float_flag_overflow | float_flag_inexact, status);
            if (    ( roundingMode == float_round_to_zero )
                 || ( zSign && ( roundingMode == float_round_up ) )
                 || ( ! zSign && ( roundingMode == float_round_down ) )
               ) {
                return packFloatx80( zSign, 0x7FFE, ~ roundMask );
            }
            return packFloatx80(zSign,
                                floatx80_infinity_high,
                                floatx80_infinity_low);
        }
        if ( zExp <= 0 ) {
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < 0 )
                || ! increment
                || ( zSig0 < UINT64_C(0xFFFFFFFFFFFFFFFF) );
            shift64ExtraRightJamming( zSig0, zSig1, 1 - zExp, &zSig0, &zSig1 );
            zExp = 0;
            if (isTiny && zSig1) {
                float_raise(float_flag_underflow, status);
            }
            if (zSig1) {
                status->float_exception_flags |= float_flag_inexact;
            }
            switch (roundingMode) {
            case float_round_nearest_even:
            case float_round_ties_away:
                increment = ((int64_t)zSig1 < 0);
                break;
            case float_round_to_zero:
                increment = 0;
                break;
            case float_round_up:
                increment = !zSign && zSig1;
                break;
            case float_round_down:
                increment = zSign && zSig1;
                break;
            default:
                abort();
            }
            if ( increment ) {
                ++zSig0;
                zSig0 &=
                    ~ ( ( (uint64_t) ( zSig1<<1 ) == 0 ) & roundNearestEven );
                if ( (int64_t) zSig0 < 0 ) zExp = 1;
            }
            return packFloatx80( zSign, zExp, zSig0 );
        }
    }
    if (zSig1) {
        status->float_exception_flags |= float_flag_inexact;
    }
    if ( increment ) {
        ++zSig0;
        if ( zSig0 == 0 ) {
            ++zExp;
            zSig0 = UINT64_C(0x8000000000000000);
        }
        else {
            zSig0 &= ~ ( ( (uint64_t) ( zSig1<<1 ) == 0 ) & roundNearestEven );
        }
    }
    else {
        if ( zSig0 == 0 ) zExp = 0;
    }
    return packFloatx80( zSign, zExp, zSig0 );

}